

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O2

int Vec_StrGetI_ne(Vec_Str_t *vOut,int *pPos)

{
  int i_00;
  byte bVar1;
  int Val;
  uint uVar2;
  int i;
  int iVar3;
  byte bVar4;
  
  uVar2 = 0;
  bVar4 = 0x18;
  for (iVar3 = 3; -1 < iVar3; iVar3 = iVar3 + -1) {
    i_00 = *pPos;
    *pPos = i_00 + 1;
    bVar1 = Vec_StrEntry(vOut,i_00);
    uVar2 = uVar2 | (uint)bVar1 << (bVar4 & 0x1f);
    bVar4 = bVar4 - 8;
  }
  return uVar2;
}

Assistant:

static inline int Vec_StrGetI_ne( Vec_Str_t * vOut, int * pPos )
{
    int i;
    int Val = 0;
//    for ( i = 0; i < 4; i++ )
    for ( i = 3; i >= 0; i-- )
        Val |= ((int)(unsigned char)Vec_StrEntry(vOut, (*pPos)++) << (8*i));
    return Val;
}